

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_rfid(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_18;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    if ((((ctx->base).tb)->cflags & 0x20000) != 0) {
      gen_io_start(tcg_ctx);
    }
    gen_update_cfar(ctx,(ctx->base).pc_next - 4);
    local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_rfid,(TCGTemp *)0x0,1,&local_18);
    ctx->exception = 0x202;
    return;
  }
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_rfid(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    /* Restore CPU state */
    CHK_SV;
    if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
        gen_io_start(tcg_ctx);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_helper_rfid(tcg_ctx, tcg_ctx->cpu_env);
    gen_sync_exception(ctx);
}